

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_set.c
# Opt level: O1

int mpt_color_typeid(void)

{
  int iVar1;
  
  iVar1 = mpt_color_typeid::ptype;
  if (mpt_color_typeid::ptype == 0) {
    iVar1 = mpt_type_basic_add(4);
    if (0 < iVar1) {
      mpt_color_typeid::ptype = iVar1;
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_color_typeid(void)
{
	static int ptype = 0;
	int type;
	if (!(type = ptype)) {
		if ((type = mpt_type_basic_add(sizeof(MPT_STRUCT(color)))) > 0) {
			ptype = type;
		}
	}
	return type;
}